

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

bool __thiscall
Hospital::Existence_Of_Id_For_Doctors
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,string *id)

{
  Doctor *this_00;
  __type _Var1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  this_00 = (All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((All_Of_Doctors->super__Vector_base<Doctor,_std::allocator<Doctor>_>)._M_impl.
      super__Vector_impl_data._M_finish == this_00) {
    _Var1 = false;
  }
  else {
    Doctor::doctor_all_ino_getter_abi_cxx11_(&local_28,this_00);
    _Var1 = std::operator==(local_28.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,id);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
  }
  return _Var1;
}

Assistant:

bool Hospital :: Existence_Of_Id_For_Doctors(vector<Doctor> All_Of_Doctors , string id){
    for (int i = 0; i <All_Of_Doctors.size() ; ++i) {
        if (All_Of_Doctors[i].doctor_all_ino_getter()[0] == id)
            return true;
        break;

    }
    return false;
}